

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_ULong FT_Stream_GetULongLE(FT_Stream stream)

{
  FT_ULong FVar1;
  uint *puVar2;
  
  puVar2 = (uint *)stream->cursor;
  if ((uchar *)((long)puVar2 + 3U) < stream->limit) {
    FVar1 = (FT_ULong)*puVar2;
    puVar2 = puVar2 + 1;
  }
  else {
    FVar1 = 0;
  }
  stream->cursor = (uchar *)puVar2;
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_GetULongLE( FT_Stream  stream )
  {
    FT_Byte*  p;
    FT_ULong  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 3 < stream->limit )
      result       = FT_NEXT_ULONG_LE( p );
    stream->cursor = p;
    return result;
  }